

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O1

void __thiscall
duckdb::DecodeSortKeyVectorData::DecodeSortKeyVectorData
          (DecodeSortKeyVectorData *this,LogicalType *type,OrderModifiers modifiers)

{
  PhysicalType PVar1;
  pointer ppVar2;
  undefined8 in_RAX;
  child_list_t<LogicalType> *pcVar3;
  LogicalType *pLVar4;
  OrderType OVar5;
  vector<duckdb::DecodeSortKeyVectorData,_true> *this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *child_type;
  pointer ppVar6;
  OrderModifiers child_modifiers;
  undefined8 uStack_28;
  
  (this->child_data).
  super_vector<duckdb::DecodeSortKeyVectorData,_std::allocator<duckdb::DecodeSortKeyVectorData>_>.
  super__Vector_base<duckdb::DecodeSortKeyVectorData,_std::allocator<duckdb::DecodeSortKeyVectorData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->child_data).
  super_vector<duckdb::DecodeSortKeyVectorData,_std::allocator<duckdb::DecodeSortKeyVectorData>_>.
  super__Vector_base<duckdb::DecodeSortKeyVectorData,_std::allocator<duckdb::DecodeSortKeyVectorData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->child_data).
  super_vector<duckdb::DecodeSortKeyVectorData,_std::allocator<duckdb::DecodeSortKeyVectorData>_>.
  super__Vector_base<duckdb::DecodeSortKeyVectorData,_std::allocator<duckdb::DecodeSortKeyVectorData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  OVar5 = modifiers.order_type;
  this->flip_bytes = OVar5 == DESCENDING;
  this->null_byte = '\x01';
  this->valid_byte = '\x02';
  if (((ushort)modifiers & 0xff00) == 0x300) {
    this->null_byte = '\x02';
    this->valid_byte = '\x01';
  }
  this_00 = &this->child_data;
  uStack_28._0_7_ = CONCAT16(OVar5,(int6)in_RAX);
  uStack_28 = CONCAT17(OVar5 == ASCENDING,(undefined7)uStack_28) | 0x200000000000000;
  PVar1 = type->physical_type_;
  if (PVar1 == LIST) {
    pLVar4 = ListType::GetChildType(type);
    ::std::vector<duckdb::DecodeSortKeyVectorData,std::allocator<duckdb::DecodeSortKeyVectorData>>::
    emplace_back<duckdb::LogicalType_const&,duckdb::OrderModifiers&>
              ((vector<duckdb::DecodeSortKeyVectorData,std::allocator<duckdb::DecodeSortKeyVectorData>>
                *)this_00,pLVar4,(OrderModifiers *)((long)&uStack_28 + 6));
  }
  else if (PVar1 == ARRAY) {
    pLVar4 = ArrayType::GetChildType(type);
    ::std::vector<duckdb::DecodeSortKeyVectorData,std::allocator<duckdb::DecodeSortKeyVectorData>>::
    emplace_back<duckdb::LogicalType_const&,duckdb::OrderModifiers&>
              ((vector<duckdb::DecodeSortKeyVectorData,std::allocator<duckdb::DecodeSortKeyVectorData>>
                *)this_00,pLVar4,(OrderModifiers *)((long)&uStack_28 + 6));
  }
  else if (PVar1 == STRUCT) {
    pcVar3 = StructType::GetChildTypes_abi_cxx11_(type);
    ppVar6 = (pcVar3->
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (pcVar3->
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar6 != ppVar2) {
      do {
        ::std::
        vector<duckdb::DecodeSortKeyVectorData,std::allocator<duckdb::DecodeSortKeyVectorData>>::
        emplace_back<duckdb::LogicalType_const&,duckdb::OrderModifiers&>
                  ((vector<duckdb::DecodeSortKeyVectorData,std::allocator<duckdb::DecodeSortKeyVectorData>>
                    *)this_00,&ppVar6->second,(OrderModifiers *)((long)&uStack_28 + 6));
        ppVar6 = ppVar6 + 1;
      } while (ppVar6 != ppVar2);
    }
  }
  return;
}

Assistant:

DecodeSortKeyVectorData(const LogicalType &type, OrderModifiers modifiers)
	    : flip_bytes(modifiers.order_type == OrderType::DESCENDING) {
		null_byte = SortKeyVectorData::NULL_FIRST_BYTE;
		valid_byte = SortKeyVectorData::NULL_LAST_BYTE;
		if (modifiers.null_type == OrderByNullType::NULLS_LAST) {
			std::swap(null_byte, valid_byte);
		}

		// NULLS FIRST/NULLS LAST passed in by the user are only respected at the top level
		// within nested types NULLS LAST/NULLS FIRST is dependent on ASC/DESC order instead
		// don't blame me this is what Postgres does
		auto child_null_type =
		    modifiers.order_type == OrderType::ASCENDING ? OrderByNullType::NULLS_LAST : OrderByNullType::NULLS_FIRST;
		OrderModifiers child_modifiers(modifiers.order_type, child_null_type);
		switch (type.InternalType()) {
		case PhysicalType::STRUCT: {
			auto &children = StructType::GetChildTypes(type);
			for (auto &child_type : children) {
				child_data.emplace_back(child_type.second, child_modifiers);
			}
			break;
		}
		case PhysicalType::ARRAY: {
			auto &child_type = ArrayType::GetChildType(type);
			child_data.emplace_back(child_type, child_modifiers);
			break;
		}
		case PhysicalType::LIST: {
			auto &child_type = ListType::GetChildType(type);
			child_data.emplace_back(child_type, child_modifiers);
			break;
		}
		default:
			break;
		}
	}